

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexInternalShape.h
# Opt level: O3

char * __thiscall
btConvexInternalShape::serialize
          (btConvexInternalShape *this,void *dataBuffer,btSerializer *serializer)

{
  int i;
  long lVar1;
  
  btCollisionShape::serialize((btCollisionShape *)this,dataBuffer,serializer);
  lVar1 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar1 * 4 + 0x20) =
         (this->m_implicitShapeDimensions).m_floats[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  lVar1 = 0;
  do {
    *(undefined4 *)((long)dataBuffer + lVar1 * 4 + 0x10) =
         *(undefined4 *)((long)(&this->m_implicitShapeDimensions + -1) + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  *(btScalar *)((long)dataBuffer + 0x30) = this->m_collisionMargin;
  return "btConvexInternalShapeData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btConvexInternalShape::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btConvexInternalShapeData* shapeData = (btConvexInternalShapeData*) dataBuffer;
	btCollisionShape::serialize(&shapeData->m_collisionShapeData, serializer);

	m_implicitShapeDimensions.serializeFloat(shapeData->m_implicitShapeDimensions);
	m_localScaling.serializeFloat(shapeData->m_localScaling);
	shapeData->m_collisionMargin = float(m_collisionMargin);

	return "btConvexInternalShapeData";
}